

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Clasp::AspParser::SmAdapter::add(SmAdapter *this,Atom_t id,StringSpan *name,bool output)

{
  unordered_map<Clasp::ConstString,_unsigned_int,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<std::pair<const_Clasp::ConstString,_unsigned_int>_>_>
  *puVar1;
  pair<const_Clasp::ConstString,_unsigned_int> *this_00;
  byte in_CL;
  ConstString n;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  value_type *in_stack_ffffffffffffff88;
  ConstString *in_stack_ffffffffffffff90;
  Id_t in_stack_ffffffffffffffb4;
  ConstString *in_stack_ffffffffffffffb8;
  LogicProgram *in_stack_ffffffffffffffc0;
  
  ConstString::ConstString(in_stack_ffffffffffffff90,(StrView *)in_stack_ffffffffffffff88);
  puVar1 = SingleOwnerPtr<std::unordered_map<Clasp::ConstString,_unsigned_int,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<std::pair<const_Clasp::ConstString,_unsigned_int>_>_>,_Clasp::DeleteObject>
           ::get((SingleOwnerPtr<std::unordered_map<Clasp::ConstString,_unsigned_int,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<std::pair<const_Clasp::ConstString,_unsigned_int>_>_>,_Clasp::DeleteObject>
                  *)0x1c7ada);
  if (puVar1 != (unordered_map<Clasp::ConstString,_unsigned_int,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<std::pair<const_Clasp::ConstString,_unsigned_int>_>_>
                 *)0x0) {
    this_00 = (pair<const_Clasp::ConstString,_unsigned_int> *)
              SingleOwnerPtr<std::unordered_map<Clasp::ConstString,_unsigned_int,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<std::pair<const_Clasp::ConstString,_unsigned_int>_>_>,_Clasp::DeleteObject>
              ::operator->((SingleOwnerPtr<std::unordered_map<Clasp::ConstString,_unsigned_int,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<std::pair<const_Clasp::ConstString,_unsigned_int>_>_>,_Clasp::DeleteObject>
                            *)0x1c7afe);
    std::pair<const_Clasp::ConstString,_unsigned_int>::
    pair<Clasp::ConstString_&,_unsigned_int_&,_true>
              (this_00,&in_stack_ffffffffffffff88->first,
               (uint *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    std::
    unordered_map<Clasp::ConstString,_unsigned_int,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<std::pair<const_Clasp::ConstString,_unsigned_int>_>_>
    ::insert((unordered_map<Clasp::ConstString,_unsigned_int,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<std::pair<const_Clasp::ConstString,_unsigned_int>_>_>
              *)this_00,in_stack_ffffffffffffff88);
    std::pair<const_Clasp::ConstString,_unsigned_int>::~pair
              ((pair<const_Clasp::ConstString,_unsigned_int> *)0x1c7b51);
  }
  if ((in_CL & 1) != 0) {
    Asp::LogicProgram::addOutput
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  }
  ConstString::~ConstString((ConstString *)0x1c7ba9);
  return;
}

Assistant:

void add(Potassco::Atom_t id, const Potassco::StringSpan& name, bool output) {
		ConstString n(name);
		if (atoms_.get()) { atoms_->insert(StrMap::value_type(n, id)); }
		if (output) { lp_->addOutput(n, id); }
	}